

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::ImageFeatureType::MergePartialFromCodedStream
          (ImageFeatureType *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  uint8 uVar3;
  byte *pbVar4;
  uint8 *puVar5;
  bool bVar6;
  uint uVar7;
  uint32 uVar8;
  long in_RAX;
  ImageFeatureType_ImageSizeRange *pIVar9;
  ImageFeatureType_EnumeratedImageSizes *pIVar10;
  pair<int,_int> pVar11;
  int iVar12;
  char cVar13;
  int iVar14;
  ulong uVar15;
  pair<unsigned_long,_bool> pVar16;
  pair<unsigned_long,_bool> pVar17;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  do {
    pbVar4 = input->buffer_;
    uVar8 = 0;
    if (pbVar4 < input->buffer_end_) {
      bVar2 = *pbVar4;
      uVar15 = (ulong)bVar2;
      pbVar1 = pbVar4 + 1;
      uVar7 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar8 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar8 = uVar7, (~(uint)*pbVar1 & uVar7) < 0x80))
        goto LAB_001efd78;
        uVar15 = (ulong)((uVar7 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar4 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar15 = uVar15 | 0x100000000;
    }
    else {
LAB_001efd78:
      uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar15 = 0;
      if (uVar8 - 1 < 0x3fff) {
        uVar15 = 0x100000000;
      }
      uVar15 = uVar8 | uVar15;
    }
    uVar8 = (uint32)uVar15;
    if ((uVar15 & 0x100000000) == 0) goto LAB_001efafa;
    uVar7 = (uint)(uVar15 >> 3) & 0x1fffffff;
    cVar13 = (char)uVar15;
    if (uVar7 < 3) {
      if (uVar7 == 1) {
        if (cVar13 == '\b') {
          puVar5 = input->buffer_;
          if ((puVar5 < input->buffer_end_) && (uVar3 = *puVar5, -1 < (long)(char)uVar3)) {
            input->buffer_ = puVar5 + 1;
            pVar16._8_8_ = 1;
            pVar16.first = (long)(char)uVar3;
          }
          else {
            pVar16 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          }
          iVar12 = 6;
          if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            this->width_ = pVar16.first;
            goto LAB_001efb23;
          }
          goto LAB_001efb25;
        }
      }
      else if ((uVar7 == 2) && (cVar13 == '\x10')) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar3 = *puVar5, -1 < (long)(char)uVar3)) {
          input->buffer_ = puVar5 + 1;
          pVar17._8_8_ = 1;
          pVar17.first = (long)(char)uVar3;
        }
        else {
          pVar17 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        iVar12 = 6;
        if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_001efb25;
        this->height_ = pVar17.first;
        goto LAB_001efb23;
      }
LAB_001efafa:
      iVar12 = 7;
      if ((uVar8 & 7) != 4 && uVar8 != 0) {
        bVar6 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar8);
        if (bVar6) {
LAB_001efb23:
          iVar12 = 0;
        }
        else {
          iVar12 = 6;
        }
      }
    }
    else if (uVar7 == 3) {
      if (cVar13 != '\x18') goto LAB_001efafa;
      pbVar4 = input->buffer_;
      if (pbVar4 < input->buffer_end_) {
        bVar2 = *pbVar4;
        uVar15 = (ulong)bVar2;
        uVar8 = (uint32)bVar2;
        if ((char)bVar2 < '\0') goto LAB_001efda8;
        input->buffer_ = pbVar4 + 1;
        bVar6 = true;
      }
      else {
        uVar8 = 0;
LAB_001efda8:
        uVar15 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
        bVar6 = -1 < (long)uVar15;
      }
      uVar7 = uStack_38._4_4_;
      if (bVar6) {
        uVar7 = (uint)uVar15;
      }
      uStack_38 = (ulong)uVar7 << 0x20;
      if (bVar6) {
        this->colorspace_ = uVar7;
        goto LAB_001efb23;
      }
      iVar12 = 6;
    }
    else if (uVar7 == 0x15) {
      if (cVar13 != -0x56) goto LAB_001efafa;
      if (this->_oneof_case_[0] != 0x15) {
        clear_SizeFlexibility(this);
        this->_oneof_case_[0] = 0x15;
        pIVar10 = (ImageFeatureType_EnumeratedImageSizes *)operator_new(0x30);
        ImageFeatureType_EnumeratedImageSizes::ImageFeatureType_EnumeratedImageSizes(pIVar10);
        (this->SizeFlexibility_).enumeratedsizes_ = pIVar10;
      }
      pIVar10 = (this->SizeFlexibility_).enumeratedsizes_;
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (iVar14 = (int)(char)*puVar5, -1 < (char)*puVar5)) {
        input->buffer_ = puVar5 + 1;
        bVar6 = true;
      }
      else {
        iVar14 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar6 = -1 < iVar14;
      }
      iVar12 = 6;
      if ((bVar6) &&
         (pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar14), -1 < (long)pVar11)) {
        bVar6 = ImageFeatureType_EnumeratedImageSizes::MergePartialFromCodedStream(pIVar10,input);
        goto LAB_001efd58;
      }
    }
    else {
      if ((uVar7 != 0x1f) || (cVar13 != -6)) goto LAB_001efafa;
      if (this->_oneof_case_[0] != 0x1f) {
        clear_SizeFlexibility(this);
        this->_oneof_case_[0] = 0x1f;
        pIVar9 = (ImageFeatureType_ImageSizeRange *)operator_new(0x28);
        ImageFeatureType_ImageSizeRange::ImageFeatureType_ImageSizeRange(pIVar9);
        (this->SizeFlexibility_).imagesizerange_ = pIVar9;
      }
      pIVar9 = (this->SizeFlexibility_).imagesizerange_;
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (iVar14 = (int)(char)*puVar5, -1 < (char)*puVar5)) {
        input->buffer_ = puVar5 + 1;
        bVar6 = true;
      }
      else {
        iVar14 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar6 = -1 < iVar14;
      }
      iVar12 = 6;
      if ((bVar6) &&
         (pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar14), -1 < (long)pVar11)) {
        bVar6 = ImageFeatureType_ImageSizeRange::MergePartialFromCodedStream(pIVar9,input);
LAB_001efd58:
        iVar12 = 6;
        if ((bVar6 != false) &&
           (bVar6 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                              (input,pVar11.first), bVar6)) goto LAB_001efb23;
      }
    }
LAB_001efb25:
    if (iVar12 != 0) {
      return iVar12 != 6;
    }
  } while( true );
}

Assistant:

bool ImageFeatureType::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ImageFeatureType)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int64 width = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &width_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int64 height = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &height_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ImageFeatureType.ColorSpace colorSpace = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_colorspace(static_cast< ::CoreML::Specification::ImageFeatureType_ColorSpace >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ImageFeatureType.EnumeratedImageSizes enumeratedSizes = 21;
      case 21: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_enumeratedsizes()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ImageFeatureType.ImageSizeRange imageSizeRange = 31;
      case 31: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(250u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_imagesizerange()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ImageFeatureType)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ImageFeatureType)
  return false;
#undef DO_
}